

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::sendErrorToFederates(CommonCore *this,int errorCode,string_view message)

{
  undefined4 in_ESI;
  ActionMessage *in_RDI;
  ActionMessage errorCom;
  action_t in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  GlobalBrokerId id;
  GlobalFederateId in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff68;
  anon_class_8_1_3b22bfd7 in_stack_ffffffffffffff70;
  
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff24.gid,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c);
  id.gid = (in_RDI->dest_handle).hid;
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffff24,id);
  SmallBuffer::operator=
            ((SmallBuffer *)CONCAT44(in_ESI,in_stack_ffffffffffffff28),
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffff24.gid,id.gid));
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,helics::GlobalFederateId,(reference_stability)0,5>::
  apply<helics::CommonCore::sendErrorToFederates(int,std::basic_string_view<char,std::char_traits<char>>)::__0>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff70);
  ActionMessage::~ActionMessage(in_RDI);
  return;
}

Assistant:

void CommonCore::sendErrorToFederates(int errorCode, std::string_view message)
{
    ActionMessage errorCom(CMD_LOCAL_ERROR);
    errorCom.source_id = global_broker_id_local;
    errorCom.messageID = errorCode;
    errorCom.payload = message;
    loopFederates.apply([&errorCom](auto& fed) {
        if ((fed) && (fed.state == OperatingState::OPERATING)) {
            fed->addAction(errorCom);
        }
    });
}